

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_topmost_tiles(tgestate_t *state)

{
  long in_RDI;
  uint8_t *window;
  tileindex_t *in_stack_00000008;
  uint8_t y;
  supertileindex_t *maptiles;
  tileindex_t *vistiles;
  
  plot_horizontal_tiles_common
            ((tgestate_t *)maptiles,in_stack_00000008,window,(uint8_t)((ulong)in_RDI >> 0x38),
             *(uint8_t **)(in_RDI + 0x790));
  return;
}

Assistant:

void plot_topmost_tiles(tgestate_t *state)
{
  tileindex_t      *vistiles; /* was DE */
  supertileindex_t *maptiles; /* was HL' */
  uint8_t           y;        /* was A */
  uint8_t          *window;   /* was DE' */

  assert(state != NULL);

  vistiles = &state->tile_buf[0];   // $F0F8 = visible tiles array + 0
  maptiles = &state->map_buf[0];    // $FF58
  y        = state->map_position.y; // map_position y
  window   = &state->window_buf[0]; // $F290

  plot_horizontal_tiles_common(state, vistiles, maptiles, y, window);
}